

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::detail::tlssPush(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  fpos<__mbstate_t> local_20;
  
  g_infoContexts::__tls_init();
  lVar1 = *in_FS_OFFSET;
  local_20 = (fpos<__mbstate_t>)std::ostream::tellp();
  std::vector<std::fpos<__mbstate_t>,std::allocator<std::fpos<__mbstate_t>>>::
  emplace_back<std::fpos<__mbstate_t>>
            ((vector<std::fpos<__mbstate_t>,std::allocator<std::fpos<__mbstate_t>>> *)
             (lVar1 + -0x1d8),&local_20);
  return (ostream *)(lVar1 + -0x1b0);
}

Assistant:

std::ostream* tlssPush() {
        return g_oss.push();
    }